

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::LabelTextV(char *label,char *fmt,__va_list_tag *args)

{
  char *buf;
  float text_baseline_y;
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fStack_84;
  ImVec2 value_size;
  ImRect value_bb;
  ImVec2 local_50;
  ImVec2 local_48;
  ImRect total_bb;
  
  pIVar4 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    fVar8 = CalcItemWidth();
    buf = pIVar4->TempBuffer;
    iVar6 = ImFormatStringV(buf,0xc01,fmt,args);
    IVar2 = CalcTextSize(buf,pIVar4->TempBuffer + iVar6,false,-1.0);
    value_size = IVar2;
    IVar3 = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar9 = IVar3.x;
    fStack_84 = IVar2.y;
    IVar2 = (pIVar1->DC).CursorPos;
    text_baseline_y = (pIVar4->Style).FramePadding.y;
    fVar11 = IVar2.x;
    value_bb.Max.x = fVar8 + fVar11;
    fVar12 = IVar2.y;
    value_bb.Max.y = fStack_84 + text_baseline_y + text_baseline_y + fVar12;
    fVar10 = 0.0;
    if (0.0 < fVar9) {
      fVar10 = (pIVar4->Style).ItemInnerSpacing.x + fVar9;
    }
    uVar7 = -(uint)(IVar3.y <= fStack_84);
    total_bb.Max.x = fVar8 + fVar10 + fVar11;
    total_bb.Min = IVar2;
    total_bb.Max.y =
         text_baseline_y + text_baseline_y +
         (float)(~uVar7 & (uint)IVar3.y | uVar7 & (uint)fStack_84) + fVar12;
    value_bb.Min.x = fVar11;
    value_bb.Min.y = fVar12;
    ItemSize(&total_bb,text_baseline_y);
    bVar5 = ItemAdd(&total_bb,0,(ImRect *)0x0,0);
    if (bVar5) {
      IVar2 = (pIVar4->Style).FramePadding;
      local_48.y = IVar2.y + fVar12;
      local_48.x = IVar2.x + fVar11;
      local_50.x = 0.0;
      local_50.y = 0.0;
      RenderTextClipped(&local_48,&value_bb.Max,buf,pIVar4->TempBuffer + iVar6,&value_size,&local_50
                        ,(ImRect *)0x0);
      if (0.0 < fVar9) {
        IVar2.y = (pIVar4->Style).FramePadding.y + value_bb.Min.y;
        IVar2.x = (pIVar4->Style).ItemInnerSpacing.x + value_bb.Max.x;
        RenderText(IVar2,label,(char *)0x0,true);
      }
    }
  }
  return;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}